

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

curl_socket_t Curl_conn_get_socket(Curl_easy *data,int sockindex)

{
  connectdata *pcVar1;
  Curl_cfilter *cf;
  curl_socket_t cVar2;
  
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    return -1;
  }
  cf = pcVar1->cfilter[sockindex];
  if ((cf != (Curl_cfilter *)0x0) && ((cf->field_0x24 & 1) == 0)) {
    cVar2 = Curl_conn_cf_get_socket(cf,data);
    return cVar2;
  }
  return pcVar1->sock[sockindex];
}

Assistant:

curl_socket_t Curl_conn_get_socket(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  cf = data->conn ? data->conn->cfilter[sockindex] : NULL;
  /* if the top filter has not connected, ask it (and its sub-filters)
   * for the socket. Otherwise conn->sock[sockindex] should have it.
   */
  if(cf && !cf->connected)
    return Curl_conn_cf_get_socket(cf, data);
  return data->conn ? data->conn->sock[sockindex] : CURL_SOCKET_BAD;
}